

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_streams.cpp
# Opt level: O1

void __thiscall despot::RandomStreams::RandomStreams(RandomStreams *this,int num_streams,int length)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> seeds;
  Random random;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  Random local_34;
  
  *(undefined8 *)
   ((long)&(this->streams_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->streams_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->streams_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->streams_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Seeds::Next(&local_50,num_streams);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->streams_,(long)num_streams);
  if (0 < num_streams) {
    uVar2 = 0;
    do {
      Random::Random(&local_34,
                     local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar2]);
      std::vector<double,_std::allocator<double>_>::resize
                ((this->streams_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar2,(long)length);
      if (0 < length) {
        uVar3 = 0;
        do {
          dVar1 = Random::NextDouble(&local_34);
          *(double *)
           (*(long *)&(this->streams_).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar2].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl + uVar3 * 8) =
               dVar1;
          uVar3 = uVar3 + 1;
        } while ((uint)length != uVar3);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)num_streams);
  }
  if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

RandomStreams::RandomStreams(int num_streams, int length) :
	position_(0) {
	vector<unsigned> seeds = Seeds::Next(num_streams);

	streams_.resize(num_streams);
	for (int i = 0; i < num_streams; i++) {
		Random random(seeds[i]);
		streams_[i].resize(length);
		for (int j = 0; j < length; j++)
			streams_[i][j] = random.NextDouble();
	}
}